

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclComputeParametersClass(SC_Lib *p,SC_Cell *pRepr,float Slew,float *pLD,float *pPD)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int local_50;
  int local_4c;
  int Count;
  int i;
  float pd;
  float ld;
  float PD;
  float LD;
  SC_Cell *pCell;
  float *pPD_local;
  float *pLD_local;
  SC_Cell *pSStack_18;
  float Slew_local;
  SC_Cell *pRepr_local;
  SC_Lib *p_local;
  
  local_50 = 0;
  Count = 0;
  i = 0;
  pd = 0.0;
  ld = 0.0;
  _PD = pRepr;
  pCell = (SC_Cell *)pPD;
  pPD_local = pLD;
  pLD_local._4_4_ = Slew;
  pSStack_18 = pRepr;
  pRepr_local = (SC_Cell *)p;
  for (local_4c = 0; fVar2 = ld, local_4c == 0 || _PD != pSStack_18; local_4c = local_4c + 1) {
    Abc_SclComputeParametersCell
              ((SC_Lib *)pRepr_local,_PD,pLD_local._4_4_,(float *)&i,(float *)&Count);
    ld = (float)i + ld;
    pd = (float)Count + pd;
    local_50 = local_50 + 1;
    _PD = _PD->pNext;
  }
  iVar3 = Abc_MaxInt(1,local_50);
  fVar1 = pd;
  *pPD_local = fVar2 / (float)iVar3;
  iVar3 = Abc_MaxInt(1,local_50);
  *(float *)&pCell->pName = fVar1 / (float)iVar3;
  return;
}

Assistant:

void Abc_SclComputeParametersClass( SC_Lib * p, SC_Cell * pRepr, float Slew, float * pLD, float * pPD )
{
    SC_Cell * pCell;
    float LD, PD, ld, pd;
    int i, Count = 0;
    LD = PD = ld = pd = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        Abc_SclComputeParametersCell( p, pCell, Slew, &ld, &pd );
        LD += ld; PD += pd;
        Count++;
    }
    *pLD = LD / Abc_MaxInt(1, Count);
    *pPD = PD / Abc_MaxInt(1, Count);
}